

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestViewSampling::initTextureObject
          (TextureViewTestViewSampling *this,bool is_view_texture,GLenum texture_target,
          GLenum view_texture_target)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLint GVar6;
  undefined4 extraout_var;
  char *pcVar8;
  MessageBuilder *pMVar9;
  TestError *this_00;
  bool bVar10;
  GLenum internalFormat;
  GLuint GVar11;
  GLuint *pGVar12;
  GLuint GVar13;
  byte bVar14;
  undefined7 in_register_00000031;
  bool bVar15;
  GLuint local_1d4;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pGVar12 = &this->m_to_id;
  if ((int)CONCAT71(in_register_00000031,is_view_texture) != 0) {
    pGVar12 = &this->m_view_to_id;
  }
  if (view_texture_target == 0x9009) {
    GVar11 = 0xd;
  }
  else if (view_texture_target == 0x8513) {
    GVar11 = 7;
  }
  else {
    GVar11 = this->m_reference_texture_depth;
  }
  GVar13 = 0x12;
  if (texture_target != 0x9009) {
    GVar13 = GVar11;
  }
  if (*pGVar12 != 0) {
    (**(code **)(lVar7 + 0x480))(1,pGVar12);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glDeleteTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1756);
  }
  local_1d4 = 1;
  (**(code **)(lVar7 + 0x6f8))(1,pGVar12);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x175b);
  if (is_view_texture) {
    bVar3 = true;
    bVar10 = true;
    if (((texture_target != 0x8c18) && (texture_target != 0x8c1a)) && (texture_target != 0x9102)) {
      bVar10 = texture_target == 0x9009;
    }
    if (((view_texture_target != 0x8c18) && (view_texture_target != 0x8c1a)) &&
       (view_texture_target != 0x9102)) {
      bVar3 = view_texture_target == 0x9009;
    }
    GVar13 = 0;
    GVar11 = 1;
    if (((texture_target != 0x84f5) && (texture_target != 0x9100)) &&
       (GVar11 = local_1d4, texture_target != 0x9102)) {
      GVar13 = 1;
      local_1d4 = 2;
      GVar11 = local_1d4;
    }
    local_1d4 = GVar11;
    bVar15 = texture_target == 0x8513;
    bVar14 = (view_texture_target != 0x8513 || bVar15) & (bVar10 ^ 1U) &
             (view_texture_target != 0x9009 || bVar15) ^ 1;
    if (view_texture_target != 0x9009 || bVar15) {
      GVar11 = 6;
      if ((view_texture_target != 0x8513) && (view_texture_target != 0x9009)) {
        if (bVar3) {
          GVar11 = (byte)(texture_target == 0x8513 | bVar10) + 1;
        }
        else {
          GVar11 = 1;
        }
      }
    }
    else {
      GVar11 = 0xc;
    }
    (**(code **)(lVar7 + 0x14b0))
              (this->m_view_to_id,view_texture_target,this->m_to_id,0x8058,GVar13,local_1d4,bVar14,
               GVar11);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTextureView() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17a3);
    this->m_iteration_view_texture_minlayer = (uint)bVar14;
    this->m_iteration_view_texture_minlevel = GVar13;
    this->m_iteration_view_texture_numlayers = GVar11;
    this->m_iteration_view_texture_numlevels = local_1d4;
    this->m_iteration_view_texture_target = view_texture_target;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Created a view for texture target ");
    std::operator<<((ostream *)poVar2,"[");
    pcVar8 = TextureViewUtilities::getTextureTargetString(view_texture_target);
    std::operator<<((ostream *)poVar2,pcVar8);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"from a parent texture target ");
    std::operator<<((ostream *)poVar2,"[");
    pcVar8 = TextureViewUtilities::getTextureTargetString(texture_target);
    std::operator<<((ostream *)poVar2,pcVar8);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"using arguments: ");
    std::operator<<((ostream *)poVar2,"minlayer:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"minlevel:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"numlayers:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"numlevels:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,"].");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    (**(code **)(lVar7 + 0xb8))(view_texture_target,this->m_view_to_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17b7);
    goto LAB_00ab2494;
  }
  this->m_iteration_parent_texture_depth = 1;
  this->m_iteration_parent_texture_height = 1;
  this->m_iteration_parent_texture_n_levels = 1;
  this->m_iteration_parent_texture_n_samples = 1;
  this->m_iteration_parent_texture_width = 1;
  (**(code **)(lVar7 + 0xb8))(texture_target,this->m_to_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x17c4);
  if ((texture_target & 0xfffffffd) == 0x9100) {
    GVar6 = getMaxConformantSampleCount(this,texture_target,internalFormat);
    this->m_max_color_texture_samples_gl_value = GVar6;
  }
  else {
    (**(code **)(lVar7 + 0x868))(0x910e,&this->m_max_color_texture_samples_gl_value);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17cf);
  }
  if (texture_target == 0x9102) {
    (**(code **)(lVar7 + 0x13a8))
              (0x9102,this->m_max_color_texture_samples_gl_value,0x8058,
               this->m_reference_texture_width,this->m_reference_texture_height,GVar11,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexStorage3DMultisample() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x185d);
    this->m_iteration_parent_texture_depth = GVar11;
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_n_samples = this->m_max_color_texture_samples_gl_value;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "Created an immutable parent texture object for texture target ");
    std::operator<<((ostream *)poVar2,"[");
    std::operator<<((ostream *)poVar2,"GL_TEXTURE_2D_MULTISAMPLE_ARRAY");
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"of ");
    std::operator<<((ostream *)poVar2,"samples:[");
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_max_color_texture_samples_gl_value);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"width:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"height:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
    poVar1 = &pMVar9->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"depth:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (texture_target == 0xde1) {
LAB_00ab1b78:
    (**(code **)(lVar7 + 0x1380))
              (texture_target,this->m_reference_texture_n_mipmaps,0x8058,
               this->m_reference_texture_width,this->m_reference_texture_height);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1802);
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "Created an immutable parent texture object for texture target ");
    std::operator<<((ostream *)poVar2,"[");
    pcVar8 = TextureViewUtilities::getTextureTargetString(texture_target);
    std::operator<<((ostream *)poVar2,pcVar8);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"of ");
    std::operator<<((ostream *)poVar2,"levels:[");
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_reference_texture_n_mipmaps);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"width:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"height:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (texture_target == 0x806f) {
LAB_00ab19c2:
    (**(code **)(lVar7 + 0x1398))
              (texture_target,this->m_reference_texture_n_mipmaps,0x8058,
               this->m_reference_texture_width,this->m_reference_texture_height,GVar13);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexStorage3D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1876);
    this->m_iteration_parent_texture_depth = GVar13;
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "Created an immutable parent texture object for texture target ");
    std::operator<<((ostream *)poVar2,"[");
    pcVar8 = TextureViewUtilities::getTextureTargetString(texture_target);
    std::operator<<((ostream *)poVar2,pcVar8);
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"of ");
    std::operator<<((ostream *)poVar2,"levels:[");
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_reference_texture_n_mipmaps);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"width:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"height:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
    poVar1 = &pMVar9->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"depth:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (texture_target == 0x84f5) {
    (**(code **)(lVar7 + 0x1380))
              (0x84f5,1,0x8058,this->m_reference_texture_width,this->m_reference_texture_height);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1818);
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "Created an immutable parent texture object for texture target ");
    std::operator<<((ostream *)poVar2,"[");
    std::operator<<((ostream *)poVar2,"GL_TEXTURE_RECTANGLE");
    std::operator<<((ostream *)poVar2,"] ");
    std::operator<<((ostream *)poVar2,"of ");
    std::operator<<((ostream *)poVar2,"levels:1 ");
    std::operator<<((ostream *)poVar2,"width:[");
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_reference_texture_width);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"height:[");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (texture_target == 0x8513) goto LAB_00ab1b78;
    if (texture_target == 0x8c18) {
      (**(code **)(lVar7 + 0x1380))
                (0x8c18,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
                 GVar11);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glTexStorage2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x17eb);
      this->m_iteration_parent_texture_depth = GVar11;
      this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
      this->m_iteration_parent_texture_width = this->m_reference_texture_width;
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Created an immutable parent texture object for texture target ");
      std::operator<<((ostream *)poVar2,"[");
      std::operator<<((ostream *)poVar2,"GL_TEXTURE_1D_ARRAY");
      std::operator<<((ostream *)poVar2,"] ");
      std::operator<<((ostream *)poVar2,"of ");
      std::operator<<((ostream *)poVar2,"depth:[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2,"] ");
      std::operator<<((ostream *)poVar2,"levels:[");
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&this->m_reference_texture_n_mipmaps);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"width:[")
      ;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if (texture_target == 0x8c1a) {
      (**(code **)(lVar7 + 0x1398))
                (0x8c1a,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
                 this->m_reference_texture_height,GVar11);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glTexStorage3D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x182d);
      this->m_iteration_parent_texture_depth = GVar11;
      this->m_iteration_parent_texture_height = this->m_reference_texture_height;
      this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
      this->m_iteration_parent_texture_width = this->m_reference_texture_width;
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Created an immutable parent texture object for texture target ");
      std::operator<<((ostream *)poVar2,"[");
      std::operator<<((ostream *)poVar2,"GL_TEXTURE_2D_ARRAY");
      std::operator<<((ostream *)poVar2,"] ");
      std::operator<<((ostream *)poVar2,"of ");
      std::operator<<((ostream *)poVar2,"depth:[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2,"] ");
      std::operator<<((ostream *)poVar2,"levels:[");
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&this->m_reference_texture_n_mipmaps);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"width:[")
      ;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"height:["
                     );
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (texture_target == 0x9009) goto LAB_00ab19c2;
      if (texture_target == 0x9100) {
        (**(code **)(lVar7 + 0x1390))
                  (0x9100,this->m_max_color_texture_samples_gl_value,0x8058,
                   this->m_reference_texture_width,this->m_reference_texture_height,1);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glTexStorage2DMultisample() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x1846);
        this->m_iteration_parent_texture_height = this->m_reference_texture_height;
        this->m_iteration_parent_texture_n_samples = this->m_max_color_texture_samples_gl_value;
        this->m_iteration_parent_texture_width = this->m_reference_texture_width;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Created an immutable parent texture object for texture target ");
        std::operator<<((ostream *)poVar2,"[");
        std::operator<<((ostream *)poVar2,"GL_TEXTURE_2D_MULTISAMPLE");
        std::operator<<((ostream *)poVar2,"] ");
        std::operator<<((ostream *)poVar2,"of ");
        std::operator<<((ostream *)poVar2,"samples:[");
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,&this->m_max_color_texture_samples_gl_value)
        ;
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "width:[");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "height:[");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_height);
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        if (texture_target != 0xde0) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized texture target.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x188b);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar7 + 0x1370))
                  (0xde0,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width)
        ;
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glTexStorage1D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x17d8);
        this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
        this->m_iteration_parent_texture_width = this->m_reference_texture_width;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Created an immutable parent texture object for texture target ");
        std::operator<<((ostream *)poVar2,"[");
        std::operator<<((ostream *)poVar2,"GL_TEXTURE_1D");
        std::operator<<((ostream *)poVar2,"] ");
        std::operator<<((ostream *)poVar2,"of ");
        std::operator<<((ostream *)poVar2,"levels:[");
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,&this->m_reference_texture_n_mipmaps);
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "width:[");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_reference_texture_width);
        std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  this->m_iteration_parent_texture_target = texture_target;
LAB_00ab2494:
  if (((texture_target != 0x84f5) && (texture_target != 0x9100)) && (texture_target != 0x9102)) {
    (**(code **)(lVar7 + 0x1360))(texture_target,0x2800,0x2600);
    (**(code **)(lVar7 + 0x1360))(texture_target,0x2801,0x2700);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexParameteri() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1899);
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::initTextureObject(bool is_view_texture, glw::GLenum texture_target,
													glw::GLenum view_texture_target)
{
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	unsigned int		  texture_depth = 0;
	glw::GLuint*		  to_id_ptr		= (is_view_texture) ? &m_view_to_id : &m_to_id;

	/* Sanity check: make sure GL_TEXTURE_BUFFER texture target is not requested. This
	 *               would be against the test specification.
	 **/
	DE_ASSERT(texture_target != GL_TEXTURE_BUFFER);
	DE_ASSERT(view_texture_target != GL_TEXTURE_BUFFER);

	/* If we're going to be creating a cube-map or cube-map array texture view in this iteration,
	 * make sure the parent or view texture's depth is valid */
	if (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texture_depth = 13; /* 1 + 2 * (6 faces) */
	}
	else if (view_texture_target == GL_TEXTURE_CUBE_MAP)
	{
		texture_depth = 7; /* 1 + (6 faces) */
	}
	else
	{
		texture_depth = m_reference_texture_depth;
	}

	if (texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texture_depth = 6 /* faces */ * 3;
	}

	/* Release the texture object, as we're using immutable texture objects and would
	 * prefer the resources not to leak.
	 */
	if (*to_id_ptr != 0)
	{
		gl.deleteTextures(1, to_id_ptr);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
	}

	/* Generate a new texture object */
	gl.genTextures(1, to_id_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	if (is_view_texture)
	{
		/* Determine values of arguments we'll pass to glTextureView() call */
		unsigned int minlayer  = 0;
		unsigned int minlevel  = 0;
		unsigned int numlayers = 0;
		unsigned int numlevels = 2;

		const bool is_texture_arrayed_texture_target =
			(texture_target == GL_TEXTURE_1D_ARRAY || texture_target == GL_TEXTURE_2D_ARRAY ||
			 texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY || texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
		const bool is_texture_cube_map_texture_target = (texture_target == GL_TEXTURE_CUBE_MAP);
		const bool is_texture_multisample_texture_target =
			(texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
		const bool is_texture_rectangle_texture_target = (texture_target == GL_TEXTURE_RECTANGLE);
		const bool is_view_arrayed_texture_target =
			(view_texture_target == GL_TEXTURE_1D_ARRAY || view_texture_target == GL_TEXTURE_2D_ARRAY ||
			 view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
			 view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
		const bool is_view_cube_map_texture_target		 = (view_texture_target == GL_TEXTURE_CUBE_MAP);
		const bool is_view_cube_map_array_texture_target = (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		if (is_texture_multisample_texture_target || is_texture_rectangle_texture_target)
		{
			minlevel  = 0;
			numlevels = 1;
		}
		else
		{
			minlevel = 1;
		}

		if ((true == is_texture_arrayed_texture_target) ||
			((false == is_texture_cube_map_texture_target) && (true == is_view_cube_map_texture_target)) ||
			((false == is_texture_cube_map_texture_target) && (true == is_view_cube_map_array_texture_target)))
		{
			minlayer = 1;
		}
		else
		{
			minlayer = 0;
		}

		if (!is_texture_cube_map_texture_target && is_view_cube_map_array_texture_target)
		{
			numlayers = 12;
		}
		else if (is_view_cube_map_texture_target || is_view_cube_map_array_texture_target)
		{
			numlayers = 6;
		}
		else if (is_view_arrayed_texture_target)
		{
			if (is_texture_arrayed_texture_target || is_texture_cube_map_texture_target)
			{
				numlayers = 2;
			}
			else
			{
				numlayers = 1;
			}
		}
		else
		{
			numlayers = 1;
		}

		/* Set up view texture */
		gl.textureView(*to_id_ptr, view_texture_target, m_to_id, GL_RGBA8, minlevel, numlevels, minlayer, numlayers);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed.");

		/* Store the argument values */
		m_iteration_view_texture_minlayer  = minlayer;
		m_iteration_view_texture_minlevel  = minlevel;
		m_iteration_view_texture_numlayers = numlayers;
		m_iteration_view_texture_numlevels = numlevels;
		m_iteration_view_texture_target	= view_texture_target;

		m_testCtx.getLog() << tcu::TestLog::Message << "Created a view for texture target "
						   << "[" << TextureViewUtilities::getTextureTargetString(view_texture_target) << "] "
						   << "from a parent texture target "
						   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
						   << "using arguments: "
						   << "minlayer:[" << minlayer << "] "
						   << "minlevel:[" << minlevel << "] "
						   << "numlayers:[" << numlayers << "] "
						   << "numlevels:[" << numlevels << "]." << tcu::TestLog::EndMessage;

		gl.bindTexture(view_texture_target, *to_id_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");
	} /* if (is_view_texture) */
	else
	{
		/* Reset iteration-specific view settings */
		m_iteration_parent_texture_depth	 = 1;
		m_iteration_parent_texture_height	= 1;
		m_iteration_parent_texture_n_levels  = 1;
		m_iteration_parent_texture_n_samples = 1;
		m_iteration_parent_texture_width	 = 1;

		/* Initialize storage for the newly created texture object */
		gl.bindTexture(texture_target, *to_id_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		/* Use max conformant sample count for multisample texture targets */
		if (texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			m_max_color_texture_samples_gl_value = getMaxConformantSampleCount(texture_target, GL_RGBA8);
		}
		else
		{
			/* Use GL_MAX_COLOR_TEXTURE_SAMPLES value for other targets */
			gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &m_max_color_texture_samples_gl_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
		}

		switch (texture_target)
		{
		case GL_TEXTURE_1D:
		{
			gl.texStorage1D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage1D() call failed.");

			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "]." << tcu::TestLog::EndMessage;
			break;
		}

		case GL_TEXTURE_1D_ARRAY:
		{
			gl.texStorage2D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "depth:[" << texture_depth << "] "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_CUBE_MAP:
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_RECTANGLE:
		{
			gl.texStorage2D(texture_target, 1, /* rectangle textures do not use mip-maps */
							GL_RGBA8, m_reference_texture_width, m_reference_texture_height);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_height = m_reference_texture_height;
			m_iteration_parent_texture_width  = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:1 "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_ARRAY:
		{
			gl.texStorage3D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height, texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "depth:[" << texture_depth << "] "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE:
		{
			gl.texStorage2DMultisample(texture_target, m_max_color_texture_samples_gl_value, GL_RGBA8,
									   m_reference_texture_width, m_reference_texture_height,
									   GL_TRUE); /* fixedsamplelocations */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed.");

			m_iteration_parent_texture_height	= m_reference_texture_height;
			m_iteration_parent_texture_n_samples = m_max_color_texture_samples_gl_value;
			m_iteration_parent_texture_width	 = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "samples:[" << m_max_color_texture_samples_gl_value << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		{
			gl.texStorage3DMultisample(texture_target, m_max_color_texture_samples_gl_value, GL_RGBA8,
									   m_reference_texture_width, m_reference_texture_height, texture_depth,
									   GL_TRUE); /* fixed sample locations */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed.");

			m_iteration_parent_texture_depth	 = texture_depth;
			m_iteration_parent_texture_height	= m_reference_texture_height;
			m_iteration_parent_texture_n_samples = m_max_color_texture_samples_gl_value;
			m_iteration_parent_texture_width	 = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "samples:[" << m_max_color_texture_samples_gl_value << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "] "
							   << "depth:[" << texture_depth << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_3D:
		case GL_TEXTURE_CUBE_MAP_ARRAY:
		{
			gl.texStorage3D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height, texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "] "
							   << "depth:[" << texture_depth << "]." << tcu::TestLog::EndMessage;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized texture target.");
		}
		} /* switch (texture_target) */

		m_iteration_parent_texture_target = texture_target;
	}

	/* Configure texture filtering */
	if (texture_target != GL_TEXTURE_2D_MULTISAMPLE && texture_target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY &&
		texture_target != GL_TEXTURE_RECTANGLE)
	{
		gl.texParameteri(texture_target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(texture_target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed.");
	}
}